

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseGlobalType(WastParser *this,Global *global)

{
  bool bVar1;
  Result RVar2;
  Var *pVVar3;
  long *plVar4;
  long lVar5;
  Var type_1;
  Var type;
  undefined1 local_110 [32];
  undefined1 *local_f0;
  undefined1 local_e8 [40];
  undefined1 local_c0 [16];
  long *local_b0 [2];
  long local_a0 [2];
  Var local_90;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar1 = MatchLpar(this,Mut);
  if (bVar1) {
    global->mutable_ = true;
    Var::Var(&local_90);
    RVar2 = ParseValueType(this,&local_90);
    if (RVar2.enum_ != Error) {
      if (local_90.type_ != Index) goto LAB_0013b8fc;
      global->type = (Type)((ulong)local_90.field_2.index_ | 0xffffffff00000000);
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"i32","");
      local_f0 = local_e8 + 8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"i64","");
      local_e8._24_8_ = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_e8 + 0x18),"f32","");
      plVar4 = local_a0;
      local_b0[0] = plVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"f64","");
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 (string *)local_110,&local_90);
      RVar2 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_48,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      lVar5 = -0x80;
      do {
        if (plVar4 != (long *)plVar4[-2]) {
          operator_delete((long *)plVar4[-2],*plVar4 + 1);
        }
        plVar4 = plVar4 + -4;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0);
      if ((RVar2.enum_ != Error) && (RVar2 = Expect(this,Rpar), RVar2.enum_ != Error)) {
        pVVar3 = &local_90;
        goto LAB_0013b8db;
      }
    }
    pVVar3 = &local_90;
  }
  else {
    Var::Var((Var *)local_110);
    RVar2 = ParseValueType(this,(Var *)local_110);
    if (RVar2.enum_ != Error) {
      if ((VarType)local_f0 == Index) {
        pVVar3 = (Var *)local_110;
        global->type = (Type)((ulong)(uint)local_e8._0_4_ | 0xffffffff00000000);
LAB_0013b8db:
        Var::~Var(pVVar3);
        return (Result)Ok;
      }
LAB_0013b8fc:
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                    ,0x3a,"Index wabt::Var::index() const");
    }
    pVVar3 = (Var *)local_110;
  }
  Var::~Var(pVVar3);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseGlobalType(Global* global) {
  WABT_TRACE(ParseGlobalType);
  if (MatchLpar(TokenType::Mut)) {
    global->mutable_ = true;
    Var type;
    CHECK_RESULT(ParseValueType(&type));
    global->type = Type(type.index());
    CHECK_RESULT(ErrorIfLpar({"i32", "i64", "f32", "f64"}));
    EXPECT(Rpar);
  } else {
    Var type;
    CHECK_RESULT(ParseValueType(&type));
    global->type = Type(type.index());
  }

  return Result::Ok;
}